

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

char * __thiscall cmsys::RegExpCompile::regatom(RegExpCompile *this,int *flagp)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  byte *__s;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  int flags;
  uint local_1c;
  
  *flagp = 0;
  __s = (byte *)this->regparse;
  pbVar1 = __s + 1;
  this->regparse = (char *)pbVar1;
  bVar2 = *__s;
  if (bVar2 < 0x3f) {
    switch(bVar2) {
    case 0x24:
      pcVar11 = this->regcode;
      if (pcVar11 == &regdummy) {
LAB_00428b3b:
        this->regsize = this->regsize + 3;
        return pcVar11;
      }
      pcVar11[0] = '\x02';
      pcVar11[1] = '\0';
LAB_00428a02:
      pcVar11[2] = '\0';
      this->regcode = pcVar11 + 3;
      return pcVar11;
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x2c:
    case 0x2d:
      goto switchD_004289b0_caseD_25;
    case 0x28:
      pcVar11 = reg(this,1,(int *)&local_1c);
      if (pcVar11 == (char *)0x0) {
        return (char *)0x0;
      }
      *flagp = *flagp | local_1c & 5;
      return pcVar11;
    case 0x29:
      break;
    case 0x2a:
    case 0x2b:
switchD_004289b0_caseD_2a:
      pcVar11 = "RegularExpression::compile(): ?+* follows nothing.";
      goto LAB_00428abb;
    case 0x2e:
      pcVar11 = this->regcode;
      if (pcVar11 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar11[0] = '\x03';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        this->regcode = pcVar11 + 3;
      }
LAB_00428ce2:
      *(byte *)flagp = (byte)*flagp | 3;
      return pcVar11;
    default:
      if (bVar2 != 0) goto switchD_004289b0_caseD_25;
    }
  }
  else {
    if (bVar2 < 0x5c) {
      if (bVar2 == 0x3f) goto switchD_004289b0_caseD_2a;
      if (bVar2 == 0x5b) {
        pcVar11 = this->regcode;
        if (*pbVar1 == 0x5e) {
          if (pcVar11 == &regdummy) {
            this->regsize = this->regsize + 3;
          }
          else {
            pcVar11[0] = '\x05';
            pcVar11[1] = '\0';
            pcVar11[2] = '\0';
            this->regcode = pcVar11 + 3;
          }
          this->regparse = this->regparse + 1;
        }
        else if (pcVar11 == &regdummy) {
          this->regsize = this->regsize + 3;
        }
        else {
          pcVar11[0] = '\x04';
          pcVar11[1] = '\0';
          pcVar11[2] = '\0';
          this->regcode = pcVar11 + 3;
        }
        pcVar5 = this->regparse;
        if ((*pcVar5 == ']') || (*pcVar5 == '-')) {
          this->regparse = pcVar5 + 1;
          pcVar6 = this->regcode;
          if (pcVar6 == &regdummy) {
            this->regsize = this->regsize + 1;
          }
          else {
            cVar4 = *pcVar5;
            this->regcode = pcVar6 + 1;
            *pcVar6 = cVar4;
          }
        }
LAB_00428c14:
        while( true ) {
          pcVar5 = this->regparse;
          cVar4 = *pcVar5;
          if (cVar4 == '-') break;
          if ((cVar4 == '\0') || (cVar4 == ']')) {
            pcVar5 = this->regcode;
            if (pcVar5 == &regdummy) {
              this->regsize = this->regsize + 1;
            }
            else {
              this->regcode = pcVar5 + 1;
              *pcVar5 = '\0';
            }
            if (*this->regparse != ']') {
              pcVar11 = "RegularExpression::compile(): Unmatched [].";
              goto LAB_00428abb;
            }
            this->regparse = this->regparse + 1;
            goto LAB_00428ce2;
          }
          this->regparse = pcVar5 + 1;
          pcVar6 = this->regcode;
          if (pcVar6 == &regdummy) {
LAB_00428c7a:
            this->regsize = this->regsize + 1;
          }
          else {
            cVar4 = *pcVar5;
            this->regcode = pcVar6 + 1;
            *pcVar6 = cVar4;
          }
        }
        this->regparse = pcVar5 + 1;
        bVar2 = pcVar5[1];
        if ((bVar2 == 0x5d) || (bVar2 == 0)) {
          pcVar5 = this->regcode;
          if (pcVar5 == &regdummy) goto LAB_00428c7a;
          this->regcode = pcVar5 + 1;
          *pcVar5 = '-';
          goto LAB_00428c14;
        }
        bVar3 = pcVar5[-1];
        uVar10 = (uint)bVar3;
        if (bVar3 <= bVar2) {
          if (bVar3 < bVar2) {
            do {
              pcVar5 = this->regcode;
              if (pcVar5 == &regdummy) {
                this->regsize = this->regsize + 1;
              }
              else {
                this->regcode = pcVar5 + 1;
                *pcVar5 = (char)uVar10 + '\x01';
              }
              uVar10 = uVar10 + 1;
            } while (bVar2 != uVar10);
          }
          this->regparse = this->regparse + 1;
          goto LAB_00428c14;
        }
        pcVar11 = "RegularExpression::compile(): Invalid range in [].";
        goto LAB_00428abb;
      }
    }
    else {
      if (bVar2 == 0x5c) {
        if (*pbVar1 != 0) {
          pcVar11 = this->regcode;
          if (pcVar11 == &regdummy) {
            this->regsize = this->regsize + 3;
          }
          else {
            pcVar11[0] = '\b';
            pcVar11[1] = '\0';
            pcVar11[2] = '\0';
            this->regcode = pcVar11 + 3;
          }
          pcVar5 = this->regparse;
          pcVar6 = this->regcode;
          this->regparse = pcVar5 + 1;
          if (pcVar6 == &regdummy) {
            this->regsize = this->regsize + 1;
          }
          else {
            cVar4 = *pcVar5;
            this->regcode = pcVar6 + 1;
            *pcVar6 = cVar4;
          }
          pcVar5 = this->regcode;
          if (pcVar5 == &regdummy) {
            this->regsize = this->regsize + 1;
          }
          else {
            this->regcode = pcVar5 + 1;
            *pcVar5 = '\0';
          }
          goto LAB_00428ce2;
        }
        pcVar11 = "RegularExpression::compile(): Trailing backslash.";
        goto LAB_00428abb;
      }
      if (bVar2 == 0x7c) goto switchD_004289b0_caseD_29;
      if (bVar2 == 0x5e) {
        pcVar11 = this->regcode;
        if (pcVar11 == &regdummy) goto LAB_00428b3b;
        pcVar11[0] = '\x01';
        pcVar11[1] = '\0';
        goto LAB_00428a02;
      }
    }
switchD_004289b0_caseD_25:
    this->regparse = (char *)__s;
    sVar7 = strcspn((char *)__s,"^$.[()|?+*\\");
    uVar10 = (uint)sVar7;
    if (0 < (int)uVar10) {
      uVar8 = 1;
      if (((uVar10 != 1) && (uVar8 = uVar10, (ulong)__s[uVar10 & 0x7fffffff] < 0x40)) &&
         ((0x80000c0000000000U >> ((ulong)__s[uVar10 & 0x7fffffff] & 0x3f) & 1) != 0)) {
        uVar8 = uVar10 - 1;
      }
      *flagp = (uint)(uVar8 == 1) * 2 + 1;
      pcVar11 = this->regcode;
      if (pcVar11 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar11[0] = '\b';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        this->regcode = pcVar11 + 3;
      }
      if (0 < (int)uVar8) {
        iVar9 = uVar8 + 1;
        do {
          pcVar5 = this->regparse;
          pcVar6 = this->regcode;
          this->regparse = pcVar5 + 1;
          if (pcVar6 == &regdummy) {
            this->regsize = this->regsize + 1;
          }
          else {
            cVar4 = *pcVar5;
            this->regcode = pcVar6 + 1;
            *pcVar6 = cVar4;
          }
          iVar9 = iVar9 + -1;
        } while (1 < iVar9);
      }
      pcVar5 = this->regcode;
      if (pcVar5 == &regdummy) {
        this->regsize = this->regsize + 1;
        return pcVar11;
      }
      this->regcode = pcVar5 + 1;
      *pcVar5 = '\0';
      return pcVar11;
    }
  }
switchD_004289b0_caseD_29:
  pcVar11 = "RegularExpression::compile(): Internal error.";
LAB_00428abb:
  puts(pcVar11);
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::regatom(int* flagp)
{
  char* ret;
  int flags;

  *flagp = WORST; // Tentatively.

  switch (*regparse++) {
    case '^':
      ret = regnode(BOL);
      break;
    case '$':
      ret = regnode(EOL);
      break;
    case '.':
      ret = regnode(ANY);
      *flagp |= HASWIDTH | SIMPLE;
      break;
    case '[': {
      int rxpclass;
      int rxpclassend;

      if (*regparse == '^') { // Complement of range.
        ret = regnode(ANYBUT);
        regparse++;
      } else
        ret = regnode(ANYOF);
      if (*regparse == ']' || *regparse == '-')
        regc(*regparse++);
      while (*regparse != '\0' && *regparse != ']') {
        if (*regparse == '-') {
          regparse++;
          if (*regparse == ']' || *regparse == '\0')
            regc('-');
          else {
            rxpclass = UCHARAT(regparse - 2) + 1;
            rxpclassend = UCHARAT(regparse);
            if (rxpclass > rxpclassend + 1) {
              // RAISE Error, SYM(RegularExpression), SYM(Invalid_Range),
              printf("RegularExpression::compile(): Invalid range in [].\n");
              return KWSYS_NULLPTR;
            }
            for (; rxpclass <= rxpclassend; rxpclass++)
              regc(static_cast<char>(rxpclass));
            regparse++;
          }
        } else
          regc(*regparse++);
      }
      regc('\0');
      if (*regparse != ']') {
        // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Bracket),
        printf("RegularExpression::compile(): Unmatched [].\n");
        return KWSYS_NULLPTR;
      }
      regparse++;
      *flagp |= HASWIDTH | SIMPLE;
    } break;
    case '(':
      ret = reg(1, &flags);
      if (ret == KWSYS_NULLPTR)
        return (KWSYS_NULLPTR);
      *flagp |= flags & (HASWIDTH | SPSTART);
      break;
    case '\0':
    case '|':
    case ')':
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n"); // Never here
      return KWSYS_NULLPTR;
    case '?':
    case '+':
    case '*':
      // RAISE Error, SYM(RegularExpression), SYM(No_Operand),
      printf("RegularExpression::compile(): ?+* follows nothing.\n");
      return KWSYS_NULLPTR;
    case '\\':
      if (*regparse == '\0') {
        // RAISE Error, SYM(RegularExpression), SYM(Trailing_Backslash),
        printf("RegularExpression::compile(): Trailing backslash.\n");
        return KWSYS_NULLPTR;
      }
      ret = regnode(EXACTLY);
      regc(*regparse++);
      regc('\0');
      *flagp |= HASWIDTH | SIMPLE;
      break;
    default: {
      int len;
      char ender;

      regparse--;
      len = int(strcspn(regparse, META));
      if (len <= 0) {
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf("RegularExpression::compile(): Internal error.\n");
        return KWSYS_NULLPTR;
      }
      ender = *(regparse + len);
      if (len > 1 && ISMULT(ender))
        len--; // Back off clear of ?+* operand.
      *flagp |= HASWIDTH;
      if (len == 1)
        *flagp |= SIMPLE;
      ret = regnode(EXACTLY);
      while (len > 0) {
        regc(*regparse++);
        len--;
      }
      regc('\0');
    } break;
  }
  return (ret);
}